

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O3

string * json_schema_to_grammar(string *__return_storage_ptr__,json *schema,bool force_gbnf)

{
  common_grammar_options local_29;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(const_common_grammar_builder_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json-schema-to-grammar.cpp:1001:26)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(const_common_grammar_builder_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json-schema-to-grammar.cpp:1001:26)>
             ::_M_manager;
  local_29.dotall = false;
  local_28._M_unused._M_object = schema;
  build_grammar_abi_cxx11_
            (__return_storage_ptr__,(function<void_(const_common_grammar_builder_&)> *)&local_28,
             &local_29);
  if (local_18 != (code *)0x0) {
    (*local_18)((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string json_schema_to_grammar(const json & schema, bool force_gbnf) {
#ifdef LLAMA_USE_LLGUIDANCE
    if (!force_gbnf) {
        return "%llguidance {}\nstart: %json " + schema.dump();
    }
#else
    (void)force_gbnf;
#endif // LLAMA_USE_LLGUIDANCE
    return build_grammar([&](const common_grammar_builder & callbacks) {
        auto copy = schema;
        callbacks.resolve_refs(copy);
        callbacks.add_schema("", copy);
    });
}